

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O3

void calculateLH(int n_vert,vec3f *position,vec3f *normal,float *LHbuffer,char *light_obj_file)

{
  vec3f *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int i;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  undefined **ppuVar7;
  vec3f *pvVar8;
  int _;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  SampleInfo info;
  TriangleMesh light;
  float y [225];
  double acc [225];
  MT19937Sampler sampler;
  undefined1 local_1f38 [8];
  float local_1f30;
  float local_1f2c;
  float local_1f28;
  float local_1f24;
  float local_1f20;
  ulong local_1f18;
  vec3f *local_1f10;
  vec3f *local_1f08;
  ulong local_1f00;
  vec3f local_1ef8;
  TriangleMesh local_1ee8;
  undefined1 local_1ea8 [16];
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float local_1e88;
  float fStack_1e84;
  float fStack_1e80;
  float fStack_1e7c;
  string local_1e78;
  float local_1e58 [228];
  double local_1ac8 [225];
  undefined **local_13c0 [625];
  undefined8 local_38;
  
  local_1f10 = position;
  local_1f08 = normal;
  github111116::ConsoleLogger::log<char[18]>(&console,(char (*) [18])"calculating LH...");
  std::__cxx11::string::string((string *)&local_1e78,light_obj_file,(allocator *)local_13c0);
  TriangleMesh::TriangleMesh(&local_1ee8,&local_1e78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e78._M_dataplus._M_p != &local_1e78.field_2) {
    operator_delete(local_1e78._M_dataplus._M_p);
  }
  if (0 < n_vert) {
    local_1f18 = (ulong)(uint)n_vert;
    uVar10 = 0;
    do {
      iVar9 = (int)uVar10;
      if (((uint)(iVar9 * -0x3d70a3d7) >> 2 | iVar9 * 0x40000000) < 0x28f5c29) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\r    LH progress: ",0x12);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,n_vert);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          ",10);
      }
      local_13c0[0] = &PTR_get1f_001b6c10;
      local_13c0[1] = (undefined **)0x0;
      lVar6 = 2;
      ppuVar7 = (undefined **)0x0;
      do {
        ppuVar7 = (undefined **)
                  (ulong)((((uint)((ulong)ppuVar7 >> 0x1e) ^ (uint)ppuVar7) * 0x6c078965 +
                          (int)lVar6) - 1);
        local_13c0[lVar6] = ppuVar7;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x271);
      local_38 = 0x270;
      iVar9 = 0;
      memset(local_1ac8,0,0x708);
      pvVar1 = local_1f10 + uVar10;
      pvVar8 = local_1f08 + uVar10;
      local_1f00 = uVar10;
      do {
        uVar4 = (*(code *)local_13c0[0][2])
                          (local_13c0,
                           (ulong)((long)local_1ee8.super_BasicContainer.list.
                                         super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1ee8.super_BasicContainer.list.
                                        super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
        (*(local_1ee8.super_BasicContainer.list.
           super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4]->super_Primitive)._vptr_Primitive[2])
                  (local_1f38,
                   local_1ee8.super_BasicContainer.list.
                   super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4],local_13c0);
        fVar11 = local_1f20 /
                 (float)(ulong)((long)local_1ee8.super_BasicContainer.list.
                                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1ee8.super_BasicContainer.list.
                                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
        local_1ef8.z = local_1f30 - pvVar1->z;
        uVar2 = pvVar1->x;
        uVar3 = pvVar1->y;
        local_1e88 = local_1f38._0_4_ - (float)uVar2;
        fStack_1e94 = local_1f38._4_4_ - (float)uVar3;
        fVar12 = local_1ef8.z * local_1ef8.z + local_1e88 * local_1e88 + fStack_1e94 * fStack_1e94;
        fStack_1e7c = 1.0 / SQRT(fVar12);
        local_1ef8.z = local_1ef8.z * fStack_1e7c;
        local_1e88 = fStack_1e7c * local_1e88;
        fStack_1e94 = fStack_1e7c * fStack_1e94;
        fStack_1e80 = fStack_1e7c * 0.0;
        fStack_1e7c = fStack_1e7c * 0.0;
        local_1ef8.y = fStack_1e94;
        local_1ef8.x = local_1e88;
        fVar13 = local_1f28 * fStack_1e94;
        fVar14 = local_1f2c * local_1e88;
        local_1ea8 = ZEXT416((uint)(local_1f24 * local_1ef8.z));
        local_1e98 = fStack_1e94 * pvVar8->y;
        local_1e88 = local_1e88 * pvVar8->x;
        fVar15 = local_1ef8.z * pvVar8->z;
        local_1f20 = fVar11;
        fStack_1e90 = fStack_1e94;
        fStack_1e8c = fStack_1e94;
        fStack_1e84 = fStack_1e94;
        SHEvaluate(&local_1ef8,0xe,local_1e58);
        fVar15 = fVar15 + local_1e88 + local_1e98;
        if (fVar15 <= 0.0) {
          fVar15 = 0.0;
        }
        lVar6 = 0;
        do {
          local_1ac8[lVar6] =
               (double)(local_1e58[lVar6] *
                       fVar15 * ABS((((float)local_1ea8._0_4_ + fVar14 + fVar13) / fVar12) / fVar11)
                       ) + local_1ac8[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0xe1);
        iVar9 = iVar9 + 1;
      } while (iVar9 != 100);
      lVar6 = 0;
      do {
        LHbuffer[lVar6] = (float)(local_1ac8[lVar6] / 100.0);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xe1);
      uVar10 = local_1f00 + 1;
      LHbuffer = LHbuffer + 0xe1;
    } while (uVar10 != local_1f18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\r    LH progress: ",0x12);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,n_vert);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,n_vert);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"           \n",0xc);
  local_1ee8.super_BasicContainer.super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001b6be8;
  if (local_1ee8.super_BasicContainer.list.
      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ee8.super_BasicContainer.list.
                    super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void calculateLH(int n_vert, const vec3f* position, const vec3f* normal, float* LHbuffer, const char light_obj_file[])
{
	console.log("calculating LH...");
	TriangleMesh light(light_obj_file);
	for (int vert=0; vert<n_vert; ++vert)
	{
		if (vert%100==0)
			std::cerr << "\r    LH progress: " << vert << "/" << n_vert << "          ";
		// sphfunc LH = [&](vec3f w)
		// {
		// 	Primitive::Hit h;
		// 	if (!light.intersect(Ray(position[i],w), &h)) return 0.0f;
		// 	if (w.y < 0) return 0.0f;
		// 	return std::max(0.0f, dot(normal[i],w));
		// };

	    MT19937Sampler sampler;

	    double acc[N_COEFFS];
    	float y[N_COEFFS];
	    memset(acc, 0, sizeof acc);
	    const int n_sample = 100;
    	for (int _=0; _<n_sample; ++_) {
			auto info = light.sampleSurface(sampler);
			vec3f w = normalized(info.p - position[vert]);
			float irr = dot(info.normal, w) / sqrlen(info.p - position[vert]) / info.pdf;
			irr = fabs(irr);
			irr *= std::max(0.0f, dot(normal[vert],w));
        	SHEvaluate(w, shorder-1, y);
	        for (int i=0; i<N_COEFFS; ++i)
	            acc[i] += irr * y[i];
    	}
    	for (int j=0; j<N_COEFFS; ++j)
    		LHbuffer[vert*N_COEFFS+j] = acc[j] / n_sample;
	}
	std::cerr << "\r    LH progress: " << n_vert << "/" << n_vert << "           \n";
}